

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderLoopTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalLoop1Iters(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_38;
  undefined1 local_1c [20];
  ShaderEvalContext *c_local;
  
  local_1c._12_8_ = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)c,1,2);
  tcu::Vector<float,_4>::xyz(&local_38,(Vec4 *)(local_1c._12_8_ + 0x250));
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_1c);
  return;
}

Assistant:

static void evalLoop1Iters	(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(1,2,3); }